

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::EnumValueDescriptor::DebugString
          (EnumValueDescriptor *this,int depth,string *contents,
          DebugStringOptions *debug_string_options)

{
  bool bVar1;
  string formatted_options;
  string prefix;
  SubstituteArg local_2a8;
  SubstituteArg local_278;
  SubstituteArg local_248;
  SubstituteArg local_218;
  SubstituteArg local_1e8;
  SubstituteArg local_1b8;
  SubstituteArg local_188;
  SubstituteArg local_158;
  SubstituteArg local_128;
  SourceLocationCommentPrinter comment_printer;
  SubstituteArg local_60;
  
  prefix._M_dataplus._M_p = (pointer)&prefix.field_2;
  std::__cxx11::string::_M_construct((ulong)&prefix,(char)depth * '\x02');
  comment_printer.source_loc_.leading_comments._M_dataplus._M_p =
       (pointer)&comment_printer.source_loc_.leading_comments.field_2;
  comment_printer.source_loc_.leading_comments._M_string_length = 0;
  comment_printer.source_loc_.leading_comments.field_2._M_local_buf[0] = '\0';
  comment_printer.source_loc_.trailing_comments._M_dataplus._M_p =
       (pointer)&comment_printer.source_loc_.trailing_comments.field_2;
  comment_printer.source_loc_.trailing_comments._M_string_length = 0;
  comment_printer.source_loc_.trailing_comments.field_2._M_local_buf[0] = '\0';
  comment_printer.source_loc_.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  comment_printer.source_loc_.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  comment_printer.source_loc_.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  comment_printer.options_.include_comments = debug_string_options->include_comments;
  comment_printer.options_.elide_group_body = debug_string_options->elide_group_body;
  comment_printer.options_.elide_oneof_body = debug_string_options->elide_oneof_body;
  std::__cxx11::string::string((string *)&comment_printer.prefix_,(string *)&prefix);
  if (debug_string_options->include_comments == true) {
    comment_printer.have_source_loc_ = GetSourceLocation(this,&comment_printer.source_loc_);
  }
  else {
    comment_printer.have_source_loc_ = false;
  }
  anon_unknown_1::SourceLocationCommentPrinter::AddPreComment(&comment_printer,contents);
  local_1e8.text_ = prefix._M_dataplus._M_p;
  local_1e8.size_ = (int)prefix._M_string_length;
  local_218.text_ = (char *)**(undefined8 **)this;
  local_218.size_ = *(int *)(*(undefined8 **)this + 1);
  strings::internal::SubstituteArg::SubstituteArg(&local_128,*(int *)(this + 0x10));
  local_60.text_ = (char *)0x0;
  local_60.size_ = -1;
  local_248.text_ = (char *)0x0;
  local_248.size_ = -1;
  local_278.text_ = (char *)0x0;
  local_278.size_ = -1;
  local_2a8.text_ = (char *)0x0;
  local_2a8.size_ = -1;
  local_158.text_ = (char *)0x0;
  local_158.size_ = -1;
  local_188.text_ = (char *)0x0;
  local_188.size_ = -1;
  local_1b8.text_ = (char *)0x0;
  local_1b8.size_ = -1;
  strings::SubstituteAndAppend
            (contents,"$0$1 = $2",&local_1e8,&local_218,&local_128,&local_60,&local_248,&local_278,
             &local_2a8,&local_158,&local_188,&local_1b8);
  formatted_options._M_dataplus._M_p = (pointer)&formatted_options.field_2;
  formatted_options._M_string_length = 0;
  formatted_options.field_2._M_local_buf[0] = '\0';
  bVar1 = anon_unknown_1::FormatBracketedOptions
                    (depth,*(Message **)(this + 0x20),
                     *(DescriptorPool **)(*(long *)(*(long *)(this + 0x18) + 0x10) + 0x10),
                     &formatted_options);
  if (bVar1) {
    local_218.text_ = (char *)0x0;
    local_218.size_ = -1;
    local_128.text_ = (char *)0x0;
    local_128.size_ = -1;
    local_60.text_ = (char *)0x0;
    local_60.size_ = -1;
    local_248.text_ = (char *)0x0;
    local_248.size_ = -1;
    local_278.text_ = (char *)0x0;
    local_278.size_ = -1;
    local_2a8.text_ = (char *)0x0;
    local_2a8.size_ = -1;
    local_158.text_ = (char *)0x0;
    local_158.size_ = -1;
    local_188.text_ = (char *)0x0;
    local_1e8.text_ = formatted_options._M_dataplus._M_p;
    local_188.size_ = -1;
    local_1b8.text_ = (char *)0x0;
    local_1e8.size_ = (int)formatted_options._M_string_length;
    local_1b8.size_ = -1;
    strings::SubstituteAndAppend
              (contents," [$0]",&local_1e8,&local_218,&local_128,&local_60,&local_248,&local_278,
               &local_2a8,&local_158,&local_188,&local_1b8);
  }
  std::__cxx11::string::append((char *)contents);
  anon_unknown_1::SourceLocationCommentPrinter::AddPostComment(&comment_printer,contents);
  std::__cxx11::string::~string((string *)&formatted_options);
  anon_unknown_1::SourceLocationCommentPrinter::~SourceLocationCommentPrinter(&comment_printer);
  std::__cxx11::string::~string((string *)&prefix);
  return;
}

Assistant:

void EnumValueDescriptor::DebugString(int depth, string *contents,
                                      const DebugStringOptions&
                                      debug_string_options) const {
  string prefix(depth * 2, ' ');

  SourceLocationCommentPrinter
      comment_printer(this, prefix, debug_string_options);
  comment_printer.AddPreComment(contents);

  strings::SubstituteAndAppend(contents, "$0$1 = $2",
                               prefix, name(), number());

  string formatted_options;
  if (FormatBracketedOptions(depth, options(), type()->file()->pool(),
                             &formatted_options)) {
    strings::SubstituteAndAppend(contents, " [$0]", formatted_options);
  }
  contents->append(";\n");

  comment_printer.AddPostComment(contents);
}